

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O1

Schema __thiscall capnp::SchemaLoader::loadOnce(SchemaLoader *this,Reader *reader)

{
  Maybe<capnp::_::RawSchema_*const_&> MVar1;
  RawSchema *pRVar2;
  unsigned_long uVar3;
  Locked<kj::Own<capnp::SchemaLoader::Impl>_> locked;
  unsigned_long local_20;
  
  uVar3 = 0;
  kj::_::Mutex::lock((Mutex *)this,EXCLUSIVE);
  if (0x3f < (reader->_reader).dataSize) {
    uVar3 = *(reader->_reader).data;
  }
  local_20 = uVar3;
  MVar1 = kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
                    ((HashMap<unsigned_long,capnp::_::RawSchema*> *)
                     &((this->impl).value.ptr)->schemas,&local_20);
  if (MVar1.ptr == (RawSchema **)0x0) {
    pRVar2 = (RawSchema *)0x0;
  }
  else {
    pRVar2 = *MVar1.ptr;
  }
  if ((pRVar2 == (RawSchema *)0x0) || (pRVar2->lazyInitializer != (Initializer *)0x0)) {
    pRVar2 = Impl::load((this->impl).value.ptr,reader,false);
  }
  if (this != (SchemaLoader *)0x0) {
    kj::_::Mutex::unlock((Mutex *)this,EXCLUSIVE);
  }
  return (Schema)&pRVar2->defaultBrand;
}

Assistant:

Schema SchemaLoader::loadOnce(const schema::Node::Reader& reader) const {
  auto locked = impl.lockExclusive();
  auto getResult = locked->get()->tryGet(reader.getId());
  if (getResult.schema == nullptr || getResult.schema->lazyInitializer != nullptr) {
    // Doesn't exist yet, or the existing schema is a placeholder and therefore has not yet been
    // seen publicly.  Go ahead and load the incoming reader.
    return Schema(&locked->get()->load(reader, false)->defaultBrand);
  } else {
    return Schema(&getResult.schema->defaultBrand);
  }
}